

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QList<QString>_>_>::erase
          (Span<QHashPrivate::Node<QString,_QList<QString>_>_> *this,size_t bucket)

{
  uchar *puVar1;
  byte bVar2;
  Entry *pEVar3;
  int *piVar4;
  uint uVar5;
  
  bVar2 = this->offsets[bucket];
  this->offsets[bucket] = 0xff;
  pEVar3 = this->entries;
  uVar5 = (uint)bVar2 * 0x30;
  puVar1 = (pEVar3->storage).data + uVar5;
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)(puVar1 + 0x18));
  piVar4 = *(int **)puVar1;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate(*(QArrayData **)((pEVar3->storage).data + uVar5),2,0x10);
    }
  }
  (this->entries->storage).data[(uint)bVar2 * 0x30] = this->nextFree;
  this->nextFree = bVar2;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }